

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O0

void __thiscall MainWindow::MainWindow(MainWindow *this,QWidget *parent)

{
  MainWindow *pMVar1;
  undefined1 local_118 [16];
  undefined8 uStack_108;
  code *local_100;
  undefined8 local_f8;
  Object local_f0 [152];
  InitGameDialog dialog;
  bool use_dialog;
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  MainWindow *this_local;
  
  local_18 = parent;
  parent_local = (QWidget *)this;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QMainWindow::QMainWindow(&this->super_QMainWindow,parent,(QFlags_conflict *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00118a90;
  *(undefined ***)&this->field_0x10 = &PTR__MainWindow_00118c48;
  pMVar1 = (MainWindow *)operator_new(0x70);
  this->ui = pMVar1;
  Ui_MainWindow::setupUi((Ui_MainWindow *)this->ui,&this->super_QMainWindow);
  dialog.ui._3_1_ = 0;
  local_100 = QAbstractButton::clicked;
  local_f8 = 0;
  local_118._8_8_ = GameBoard::beginNewGame;
  uStack_108 = 0;
  QObject::connect<void(QAbstractButton::*)(bool),void(GameBoard::*)()>
            (local_f0,*(offset_in_QAbstractButton_to_subr *)(this->ui + 0x10),
             (Object *)QAbstractButton::clicked,0,(ConnectionType)*(undefined8 *)(this->ui + 0x58));
  QMetaObject::Connection::~Connection((Connection *)local_f0);
  QObject::connect<void(GameBoard::*)(int),void(MainWindow::*)(int)>
            ((Object *)local_118,*(offset_in_GameBoard_to_subr *)(this->ui + 0x58),
             (Object *)GameBoard::gameOver,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_118);
  GameBoard::init(*(GameBoard **)(this->ui + 0x58),(EVP_PKEY_CTX *)0x3);
  return;
}

Assistant:

MainWindow::MainWindow(QWidget *parent)
    : QMainWindow(parent)
    , ui(new Ui::MainWindow)
{
    ui->setupUi(this);

    bool use_dialog = false; //production mode command to avoid having to use the dialog every time app is started
    if(use_dialog)
    {
        InitGameDialog dialog(this);
        if(dialog.exec() == QDialog::Rejected)
            return; //Rejected happens if user presses cancel

        ui->player1Label->setText(dialog.player1Name());
        ui->player2Label->setText(dialog.player2Name());
        ui->gameBoard->init(dialog.boardWidth());

        connect(ui->beginNewGameButton, &QPushButton::clicked, ui->gameBoard, &GameBoard::beginNewGame);
        connect(ui->gameBoard, &GameBoard::gameOver, this, &MainWindow::handleGameOver);
    }
    else // production mode
    {
        connect(ui->beginNewGameButton, &QPushButton::clicked, ui->gameBoard, &GameBoard::beginNewGame);
        connect(ui->gameBoard, &GameBoard::gameOver, this, &MainWindow::handleGameOver);
        ui->gameBoard->init(3);
    }

}